

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_UpdRegistrar_Test::TestBody
          (PersistentStorageJsonTestSuite_UpdRegistrar_Test *this)

{
  Status SVar1;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  allocator local_141;
  AssertHelper local_140;
  allocator local_132;
  allocator_type local_131;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__6;
  RegistrarId newId;
  Registrar returnValue;
  Registrar newValue;
  PersistentStorageJson psj;
  
  unlink("./tmp/test.tmp");
  std::__cxx11::string::string((string *)&newValue,"./tmp/test.tmp",(allocator *)&returnValue);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)&newValue);
  std::__cxx11::string::~string((string *)&newValue);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  returnValue.mAddr._M_dataplus._M_p = (pointer)0x0;
  returnValue.mId.mId._0_1_ = SVar1 == kSuccess;
  if (SVar1 != kSuccess) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&newValue,(internal *)&returnValue,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1af,(char *)CONCAT44(newValue._4_4_,newValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6,(Message *)&gtest_ar__4)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6);
    std::__cxx11::string::~string((string *)&newValue);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&returnValue.mAddr);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&newId);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&local_140,0xffffffff);
  std::__cxx11::string::string((string *)&returnValue,"0.0.0.1",&local_141);
  std::__cxx11::string::string((string *)&gtest_ar__4,"dom1",&local_132);
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar__4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar__6,__l,&local_131);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&newValue,(RegistrarId *)&local_140,(string *)&returnValue,1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__6);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&newValue,&newId);
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::Registrar::~Registrar(&newValue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&returnValue);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&returnValue);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&newValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.1\", 1, {\"dom1\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b4,(char *)CONCAT44(newValue._4_4_,newValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&returnValue)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&newValue);
    if ((long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&local_140,0xffffffff);
  std::__cxx11::string::string((string *)&returnValue,"0.0.0.2",&local_141);
  std::__cxx11::string::string((string *)&gtest_ar__4,"dom2",&local_132);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&gtest_ar__4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar__6,__l_00,&local_131);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&newValue,(RegistrarId *)&local_140,(string *)&returnValue,2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__6);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&newValue,&newId);
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::Registrar::~Registrar(&newValue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&returnValue);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&returnValue);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&newValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.2\", 2, {\"dom2\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b5,(char *)CONCAT44(newValue._4_4_,newValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&returnValue)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&newValue);
    if ((long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&local_140,0xffffffff);
  std::__cxx11::string::string((string *)&returnValue,"0.0.0.3",&local_141);
  std::__cxx11::string::string((string *)&gtest_ar__4,"dom3",&local_132);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&gtest_ar__4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar__6,__l_01,&local_131);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&newValue,(RegistrarId *)&local_140,(string *)&returnValue,3,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__6);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&newValue,&newId);
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::Registrar::~Registrar(&newValue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&returnValue);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&returnValue);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&newValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.3\", 3, {\"dom3\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b6,(char *)CONCAT44(newValue._4_4_,newValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&returnValue)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&newValue);
    if ((long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(returnValue._4_4_,returnValue.mId.mId) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&gtest_ar__1,0xffffffff);
  std::__cxx11::string::string((string *)&returnValue,"4.4.4.4",(allocator *)&local_140);
  std::__cxx11::string::string((string *)&gtest_ar__4,"dom4",&local_141);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&gtest_ar__4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar__6,__l_02,(allocator_type *)&local_132);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&newValue,(RegistrarId *)&gtest_ar__1,(string *)&returnValue,1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar__6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  std::__cxx11::string::~string((string *)&returnValue);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Update(&psj,&newValue);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kNotFound;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar__4,
               (AssertionResult *)"psj.Update(newValue) == PersistentStorage::Status::kNotFound",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1bb,(char *)CONCAT44(returnValue._4_4_,returnValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar__6)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&returnValue.mId,2);
  newValue.mId = returnValue.mId;
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Update(&psj,&newValue);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SVar1 == kSuccess;
  if (!gtest_ar__4.success_) {
    testing::Message::Message((Message *)&gtest_ar__6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar__4,
               (AssertionResult *)"psj.Update(newValue) == PersistentStorage::Status::kSuccess",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1bd,(char *)CONCAT44(returnValue._4_4_,returnValue.mId.mId));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar__6)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  ot::commissioner::persistent_storage::Registrar::Registrar(&returnValue);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&gtest_ar__4,2);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&gtest_ar__4,&returnValue);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__6.success_ = SVar1 == kSuccess;
  if (!gtest_ar__6.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
               (AssertionResult *)
               "psj.Get(RegistrarId(2), returnValue) == PersistentStorage::Status::kSuccess","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c1,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__6.message_);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__6.success_ = returnValue.mId.mId == 2;
  if (!gtest_ar__6.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
               (AssertionResult *)"returnValue.mId.mId == 2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c2,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__6.message_);
  gtest_ar__6.success_ = std::operator==(&returnValue.mAddr,"4.4.4.4");
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__6.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
               (AssertionResult *)"returnValue.mAddr == \"4.4.4.4\"","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c3,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__6.message_);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__6.success_ = returnValue.mPort == 1;
  if (!gtest_ar__6.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
               (AssertionResult *)"returnValue.mPort == 1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c4,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__6.message_);
  std::__cxx11::string::string((string *)&gtest_ar__4,"dom4",(allocator *)&local_140);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&gtest_ar__4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar__6,__l_03,(allocator_type *)&local_141);
  gtest_ar__1.success_ =
       std::operator==(&returnValue.mDomains,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&gtest_ar__6);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)&gtest_ar__4);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__6);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__1,
               (AssertionResult *)"returnValue.mDomains == std::vector<std::string>{\"dom4\"}",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c5,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__6);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__6._1_7_,gtest_ar__6.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__6.success_ = SVar1 == kSuccess;
  if (!gtest_ar__6.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c7,(char *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__6.message_);
  ot::commissioner::persistent_storage::Registrar::~Registrar(&returnValue);
  ot::commissioner::persistent_storage::Registrar::~Registrar(&newValue);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, UpdRegistrar)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Add initial data
    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 2, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);

    // Test actions
    Registrar newValue{EMPTY_ID, "4.4.4.4", 1, {"dom4"}};

    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kNotFound);
    newValue.mId = 2;
    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kSuccess);

    Registrar returnValue;

    EXPECT_TRUE(psj.Get(RegistrarId(2), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 2);
    EXPECT_TRUE(returnValue.mAddr == "4.4.4.4");
    EXPECT_TRUE(returnValue.mPort == 1);
    EXPECT_TRUE(returnValue.mDomains == std::vector<std::string>{"dom4"});

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}